

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::TimeInfo::TimeInfo(TimeInfo *this,time_point now)

{
  undefined1 auVar1 [16];
  tm *ptVar2;
  ulong uVar3;
  int *in_RDI;
  size_t us_epoch;
  tm *lt_tm;
  time_t raw_time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffd0;
  time_t local_18 [2];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_8;
  
  local_18[0] = std::chrono::_V2::system_clock::to_time_t
                          ((time_point *)in_stack_ffffffffffffffd0.__r);
  ptVar2 = localtime(local_18);
  *in_RDI = ptVar2->tm_year + 0x76c;
  in_RDI[1] = ptVar2->tm_mon + 1;
  in_RDI[2] = ptVar2->tm_mday;
  in_RDI[3] = ptVar2->tm_hour;
  in_RDI[4] = ptVar2->tm_min;
  in_RDI[5] = ptVar2->tm_sec;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch(&local_8);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_ffffffffffffffb8);
  uVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffffd0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3 / 1000;
  in_RDI[6] = SUB164(auVar1 % ZEXT816(1000),0);
  in_RDI[7] = (int)(uVar3 % 1000);
  return;
}

Assistant:

TimeInfo(std::chrono::system_clock::time_point now) {
            std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
            std::tm* lt_tm = std::localtime(&raw_time);
            year = lt_tm->tm_year + 1900;
            month = lt_tm->tm_mon + 1;
            day = lt_tm->tm_mday;
            hour = lt_tm->tm_hour;
            min = lt_tm->tm_min;
            sec = lt_tm->tm_sec;

            size_t us_epoch = std::chrono::duration_cast
                              < std::chrono::microseconds >
                              ( now.time_since_epoch() ).count();
            msec = (us_epoch / 1000) % 1000;
            usec = us_epoch % 1000;
        }